

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::Transaction::Transaction(Transaction *this,int32_t version,uint32_t lock_time)

{
  CfdException *this_00;
  allocator local_71;
  string local_70;
  CfdSourceLocation local_50;
  int local_24;
  wally_tx *pwStack_20;
  int ret;
  wally_tx *tx_pointer;
  uint32_t lock_time_local;
  int32_t version_local;
  Transaction *this_local;
  
  tx_pointer._0_4_ = lock_time;
  tx_pointer._4_4_ = version;
  _lock_time_local = this;
  AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__Transaction_00896448;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::vector(&this->vin_);
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector(&this->vout_);
  pwStack_20 = (wally_tx *)0x0;
  local_24 = wally_tx_init_alloc(tx_pointer._4_4_,(uint32_t)tx_pointer,0,0,&stack0xffffffffffffffe0)
  ;
  if (local_24 != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0xcf;
    local_50.funcname = "Transaction";
    logger::warn<int&>(&local_50,"wally_tx_init_alloc NG[{}] ",&local_24);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"transaction data generate error.",&local_71)
    ;
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_70);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (this->super_AbstractTransaction).wally_tx_pointer_ = pwStack_20;
  return;
}

Assistant:

Transaction::Transaction(int32_t version, uint32_t lock_time)
    : vin_(), vout_() {
  struct wally_tx *tx_pointer = NULL;
  int ret = wally_tx_init_alloc(version, lock_time, 0, 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_init_alloc NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "transaction data generate error.");
  }
  wally_tx_pointer_ = tx_pointer;
}